

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O0

void eat_CWS(QByteArrayView *data)

{
  long lVar1;
  bool bVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_00000010 [16];
  R_conflict6 comment;
  QByteArrayView *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  eat_OWS(in_stack_ffffffffffffffb8);
  while( true ) {
    parse_comment((QByteArrayView)in_stack_00000010);
    bVar2 = parse_comment(QByteArrayView)::R::operator_cast_to_bool((R_conflict6 *)0x335085);
    if (!bVar2) break;
    *in_RDI = 0xaaaaaaaaaaaaaaaa;
    in_RDI[1] = 0xaaaaaaaaaaaaaaaa;
    eat_OWS(in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static constexpr void eat_CWS(QByteArrayView &data) noexcept
{
    eat_OWS(data);
    while (const auto comment = parse_comment(data)) {
        data = comment.tail;
        eat_OWS(data);
    }
}